

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package_list.h
# Opt level: O0

void __thiscall PackageList::freeze(PackageList *this)

{
  bool bVar1;
  reference ppVar2;
  ostream *poVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>
  *p;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>_>
  *__range1;
  PackageList *this_local;
  
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>_>
           ::begin(&this->packages);
  p = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>_>
         ::end(&this->packages);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&p);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>
             ::operator*(&__end1);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&ppVar2->second);
    poVar3 = std::operator<<(poVar3,"==");
    poVar3 = std::operator<<(poVar3,(string *)&(ppVar2->second).version);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void freeze(){
        for(auto&p:packages){
            std::cout << p.second.name << "==" << p.second.version << std::endl;
        }
	}